

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O2

int Pdr_ManFreeVar(Pdr_Man_t *p,int k)

{
  int iVar1;
  sat_solver *s;
  Vec_Int_t *p_00;
  
  if (p->pPars->fMonoCnf != 0) {
    s = Pdr_ManSolver(p,k);
    iVar1 = sat_solver_nvars(s);
    return iVar1;
  }
  p_00 = (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids,k);
  Vec_IntPush(p_00,-1);
  return p_00->nSize + -1;
}

Assistant:

int Pdr_ManFreeVar( Pdr_Man_t * p, int k )
{
    if ( p->pPars->fMonoCnf )
        return sat_solver_nvars( Pdr_ManSolver(p, k) );
    else
    {
        Vec_Int_t * vVar2Ids = (Vec_Int_t *)Vec_PtrEntry( &p->vVar2Ids, k );
        Vec_IntPush( vVar2Ids, -1 );
        return Vec_IntSize( vVar2Ids ) - 1;
    }
}